

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle_tree.cpp
# Opt level: O2

tuple<libtorrent::aux::merkle_tree::set_block_result,_int,_int> __thiscall
libtorrent::aux::merkle_tree::set_block(merkle_tree *this,int block_index,sha256_hash *h)

{
  uint *puVar1;
  pointer pdVar2;
  libtorrent *plVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  set_block_result extraout_EDX;
  set_block_result extraout_EDX_00;
  set_block_result extraout_EDX_01;
  set_block_result extraout_EDX_02;
  set_block_result extraout_EDX_03;
  _Head_base<0UL,_libtorrent::aux::merkle_tree::set_block_result,_false> _Var11;
  undefined4 uVar10;
  sha256_hash *in_RCX;
  int i;
  int idx;
  uint index;
  undefined4 in_register_00000034;
  merkle_tree *this_00;
  int level_start;
  span<libtorrent::digest32<256L>_> tree;
  span<libtorrent::digest32<256L>_> tree_00;
  tuple<libtorrent::aux::merkle_tree::set_block_result,_int,_int> tVar12;
  span<const_libtorrent::digest32<256L>_> tree_01;
  undefined1 local_6c [20];
  sha256_hash root;
  
  this_00 = (merkle_tree *)CONCAT44(in_register_00000034,block_index);
  iVar8 = merkle_num_leafs(this_00->m_num_blocks);
  iVar9 = merkle_first_leaf(iVar8);
  iVar8 = (int)h;
  idx = iVar9 + iVar8;
  bVar7 = blocks_verified(this_00,iVar8,1);
  if (bVar7) {
    bVar7 = compare_node(this_00,idx,in_RCX);
    *(undefined4 *)&this->m_root = 1;
    *(int *)((long)&this->m_root + 4) = iVar8;
    _Var11._M_head_impl = extraout_EDX;
    if (bVar7) {
      *(undefined4 *)
       &(this->m_tree).
        super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
        ._M_impl.super__Vector_impl_data._M_start = 0;
    }
    else {
      *(undefined4 *)
       &(this->m_tree).
        super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
        ._M_impl.super__Vector_impl_data._M_start = 3;
    }
    goto LAB_0020c752;
  }
  local_6c._12_8_ = this;
  allocate_full(this_00);
  pdVar2 = (this_00->m_tree).
           super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
           super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = *(undefined8 *)(in_RCX->m_number)._M_elems;
  uVar5 = *(undefined8 *)((in_RCX->m_number)._M_elems + 2);
  uVar6 = *(undefined8 *)((in_RCX->m_number)._M_elems + 6);
  puVar1 = (uint *)((long)pdVar2[idx].m_number._M_elems + 0x10);
  *(undefined8 *)puVar1 = *(undefined8 *)((in_RCX->m_number)._M_elems + 4);
  *(undefined8 *)(puVar1 + 2) = uVar6;
  pdVar2 = pdVar2 + idx;
  *(undefined8 *)(pdVar2->m_number)._M_elems = uVar4;
  *(undefined8 *)((long)(pdVar2->m_number)._M_elems + 8) = uVar5;
  pdVar2 = (this_00->m_tree).
           super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
           super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  level_start = this_00->m_num_blocks;
  tree_01.m_len = (difference_type)pdVar2;
  tree_01.m_ptr = (digest32<256L> *)local_6c;
  merkle_find_known_subtree
            (tree_01,(int)((long)(this_00->m_tree).
                                 super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                 .
                                 super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar2 >> 5),
             iVar8);
  bVar7 = digest32<256L>::is_all_zeros
                    ((this_00->m_tree).
                     super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                     .
                     super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + (int)local_6c._0_4_);
  if (bVar7) {
    *(ulong *)local_6c._12_8_ = CONCAT44(local_6c._8_4_,local_6c._4_4_);
    *(undefined4 *)
     &(((vector<sha256_hash> *)(local_6c._12_8_ + 8))->
      super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>).
      super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
      _M_impl.super__Vector_impl_data._M_start = 1;
    this = (merkle_tree *)local_6c._12_8_;
    _Var11._M_head_impl = extraout_EDX_00;
    goto LAB_0020c752;
  }
  plVar3 = (libtorrent *)
           (this_00->m_tree).
           super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
           super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  root.m_number._M_elems._0_8_ = *(undefined8 *)(plVar3 + (long)(int)local_6c._0_4_ * 0x20);
  root.m_number._M_elems._8_8_ = *(undefined8 *)(plVar3 + (long)(int)local_6c._0_4_ * 0x20 + 8);
  root.m_number._M_elems._16_8_ = *(undefined8 *)(plVar3 + (long)(int)local_6c._0_4_ * 0x20 + 0x10);
  root.m_number._M_elems._24_8_ =
       *(undefined8 *)(plVar3 + (long)(int)local_6c._0_4_ * 0x20 + 0x10 + 8);
  tree.m_ptr = (long)(this_00->m_tree).
                     super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                     .
                     super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)plVar3 >> 5;
  tree.m_len._0_4_ = local_6c._4_4_;
  tree.m_len._4_4_ = 0;
  merkle_fill_tree(plVar3,tree,local_6c._8_4_ + iVar9,level_start);
  bVar7 = digest32<256L>::operator!=
                    (&root,(this_00->m_tree).
                           super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                           .
                           super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + (int)local_6c._0_4_);
  if (bVar7) {
    plVar3 = (libtorrent *)
             (this_00->m_tree).
             super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
             super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    tree_00.m_ptr =
         (long)(this_00->m_tree).
               super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
               .
               super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)plVar3 >> 5;
    tree_00.m_len._0_4_ = local_6c._4_4_;
    tree_00.m_len._4_4_ = 0;
    merkle_clear_tree(plVar3,tree_00,iVar9 + local_6c._8_4_,level_start);
    pdVar2 = (this_00->m_tree).
             super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
             super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = (uint *)((long)pdVar2[(int)local_6c._0_4_].m_number._M_elems + 0x10);
    *(undefined8 *)puVar1 = root.m_number._M_elems._16_8_;
    *(undefined8 *)(puVar1 + 2) = root.m_number._M_elems._24_8_;
    pdVar2 = pdVar2 + (int)local_6c._0_4_;
    *(undefined8 *)(pdVar2->m_number)._M_elems = root.m_number._M_elems._0_8_;
    *(undefined8 *)((long)(pdVar2->m_number)._M_elems + 8) = root.m_number._M_elems._8_8_;
    uVar10 = 2;
    _Var11._M_head_impl = extraout_EDX_01;
  }
  else {
    iVar9 = local_6c._4_4_ + local_6c._8_4_;
    if (this_00->m_num_blocks <= (int)(local_6c._4_4_ + local_6c._8_4_)) {
      iVar9 = this_00->m_num_blocks;
    }
    for (index = local_6c._8_4_; (int)index < iVar9; index = index + 1) {
      bitfield::set_bit(&this_00->m_block_verified,index);
    }
    if (this_00->m_num_blocks + -1 != iVar8) {
      bVar7 = digest32<256L>::is_all_zeros
                        ((this_00->m_tree).
                         super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         .
                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + (long)idx + 1);
      uVar10 = 0;
      _Var11._M_head_impl = extraout_EDX_02;
      if (bVar7) goto LAB_0020c742;
    }
    optimize_storage(this_00);
    uVar10 = 0;
    _Var11._M_head_impl = extraout_EDX_03;
  }
LAB_0020c742:
  *(ulong *)local_6c._12_8_ = CONCAT44(local_6c._8_4_,local_6c._4_4_);
  *(undefined4 *)
   &(((vector<sha256_hash> *)(local_6c._12_8_ + 8))->
    super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>).
    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    _M_impl.super__Vector_impl_data._M_start = uVar10;
  this = (merkle_tree *)local_6c._12_8_;
LAB_0020c752:
  tVar12.super__Tuple_impl<0UL,_libtorrent::aux::merkle_tree::set_block_result,_int,_int>.
  super__Head_base<0UL,_libtorrent::aux::merkle_tree::set_block_result,_false>._M_head_impl =
       _Var11._M_head_impl;
  tVar12.super__Tuple_impl<0UL,_libtorrent::aux::merkle_tree::set_block_result,_int,_int>.
  super__Tuple_impl<1UL,_int,_int> = (_Tuple_impl<1UL,_int,_int>)this;
  return (tuple<libtorrent::aux::merkle_tree::set_block_result,_int,_int>)
         tVar12.super__Tuple_impl<0UL,_libtorrent::aux::merkle_tree::set_block_result,_int,_int>;
}

Assistant:

std::tuple<merkle_tree::set_block_result, int, int> merkle_tree::set_block(int const block_index
		, sha256_hash const& h)
	{
#ifdef TORRENT_EXPENSIVE_INVARIANT_CHECKS
		INVARIANT_CHECK;
#endif
		TORRENT_ASSERT(block_index < m_num_blocks);

		auto const num_leafs = merkle_num_leafs(m_num_blocks);
		auto const first_leaf = merkle_first_leaf(num_leafs);
		auto const block_tree_index = first_leaf + block_index;

		if (blocks_verified(block_index, 1))
		{
			// if this blocks's hash is already known, check the passed-in hash against it
			if (compare_node(block_tree_index, h))
				return std::make_tuple(set_block_result::ok, block_index, 1);
			else
				return std::make_tuple(set_block_result::block_hash_failed, block_index, 1);
		}

		allocate_full();

		m_tree[block_tree_index] = h;

		// to avoid wasting a lot of time hashing nodes only to discover they
		// cannot be verified, check first to see if the root of the largest
		// computable subtree is known

		auto const [leafs_start, leafs_size, root_index] =
			merkle_find_known_subtree(m_tree, block_index, m_num_blocks);

		// if the root node is unknown the hashes cannot be verified yet
		if (m_tree[root_index].is_all_zeros())
			return std::make_tuple(set_block_result::unknown, leafs_start, leafs_size);

		// save the root hash because merkle_fill_tree will overwrite it
		sha256_hash const root = m_tree[root_index];
		merkle_fill_tree(m_tree, leafs_size, first_leaf + leafs_start);

		if (root != m_tree[root_index])
		{
			// hash failure, clear all the internal nodes
			// the whole piece failed the hash check. Clear all block hashes
			// in this piece and report a hash failure
			merkle_clear_tree(m_tree, leafs_size, first_leaf + leafs_start);
			m_tree[root_index] = root;
			return std::make_tuple(set_block_result::hash_failed, leafs_start, leafs_size);
		}

		// TODO: this could be done more efficiently if bitfield had a function
		// to set a range of bits
		int const leafs_end = std::min(m_num_blocks, leafs_start + leafs_size);
		for (int i = leafs_start; i < leafs_end; ++i)
			m_block_verified.set_bit(i);

		// attempting to optimize storage is quite costly, only do it if we have
		// a reason to believe it might have an effect
		if (block_index == m_num_blocks - 1 || !m_tree[block_tree_index + 1].is_all_zeros())
			optimize_storage();

		return std::make_tuple(set_block_result::ok, leafs_start, leafs_size);
	}